

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.hpp
# Opt level: O2

void __thiscall
oqpi::
worker<oqpi::itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>,_oqpi::itfc::semaphore<oqpi::posix_semaphore,_oqpi::local_sync_object>,_oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::worker_base>_>
::start(worker<oqpi::itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>,_oqpi::itfc::semaphore<oqpi::posix_semaphore,_oqpi::local_sync_object>,_oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::worker_base>_>
        *this)

{
  int __val;
  thread_attributes threadAttributes;
  string local_60;
  anon_class_8_1_8991fb9c_for__M_head_impl local_40;
  thread_attributes local_38;
  
  LOCK();
  (this->running_)._M_base._M_i = true;
  UNLOCK();
  thread_attributes::thread_attributes
            (&local_38,&(this->super_worker_base).config_.threadAttributes);
  __val = (this->super_worker_base).id_;
  if (-1 < __val) {
    std::__cxx11::to_string(&local_60,__val);
    std::__cxx11::string::append((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_60);
  }
  local_40.this = this;
  itfc::thread<oqpi::posix_thread,oqpi::empty_layer>::
  thread<oqpi::worker<oqpi::itfc::thread<oqpi::posix_thread,oqpi::empty_layer>,oqpi::itfc::semaphore<oqpi::posix_semaphore,oqpi::local_sync_object>,oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::worker_base>>::start()::_lambda()_1_>
            ((thread<oqpi::posix_thread,oqpi::empty_layer> *)&local_60,&local_38,&local_40);
  itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>::operator=
            (&this->thread_,(self_type *)&local_60);
  itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>::~thread
            ((thread<oqpi::posix_thread,_oqpi::empty_layer> *)&local_60);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

virtual void start() override final
        {
            // Important to set the worker as running before starting the thread
            running_.store(true);

            // Add the id to the worker name so we can differentiate them when several workers
            // share the same config (and thus the same name)
            auto threadAttributes = worker_base::config_.threadAttributes;
            if (id_ >= 0)
            {
                threadAttributes.name_ += std::to_string(id_);
            }

            // Start the thread, running_ must be set to true beforehand
            thread_ = _Thread(threadAttributes, [this]() { run(); });
        }